

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O3

void __thiscall Args::CmdLine::CmdLine(CmdLine *this,int argc,char **argv,CmdLineOpts opt)

{
  iterator iVar1;
  ulong uVar2;
  QArrayDataPointer<Args::String> local_68;
  String local_48;
  
  (this->super_CmdLineAPI<CmdLine,_CmdLine,_ArgPtrToAPI>).m_parent = this;
  (this->super_CmdLineAPI<CmdLine,_CmdLine,_ArgPtrToAPI>).m_self = this;
  (this->super_CmdLineAPI<CmdLine,_CmdLine,_ArgPtrToAPI>)._vptr_API =
       (_func_int **)&PTR__CmdLine_00115d40;
  local_68.d._0_4_ = 0;
  local_68.d._4_4_ = 0;
  local_68.ptr._0_4_ = 0;
  local_68.ptr._4_4_ = 0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (String *)0x0;
  local_68.size = 0;
  if (argc < 2) {
    local_68.size = 0;
  }
  else {
    uVar2 = 1;
    do {
      String::String(&local_48,argv[uVar2]);
      QtPrivate::QGenericArrayOps<Args::String>::emplace<Args::String>
                ((QGenericArrayOps<Args::String> *)&local_68,local_68.size,&local_48);
      if (&(local_48.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_48.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_48.m_str.d.d)->super_QArrayData,2,8);
        }
      }
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  *(undefined4 *)&(this->m_context).m_context.d.d = local_68.d._0_4_;
  *(undefined4 *)((long)&(this->m_context).m_context.d.d + 4) = local_68.d._4_4_;
  *(undefined4 *)&(this->m_context).m_context.d.ptr = local_68.ptr._0_4_;
  *(undefined4 *)((long)&(this->m_context).m_context.d.ptr + 4) = local_68.ptr._4_4_;
  (this->m_context).m_context.d.size = local_68.size;
  local_68.d = (Data *)0x0;
  local_68.ptr = (String *)0x0;
  local_68.size = 0;
  iVar1 = QList<Args::String>::begin(&(this->m_context).m_context);
  (this->m_context).m_it.i = iVar1.i;
  QArrayDataPointer<Args::String>::~QArrayDataPointer(&local_68);
  (this->m_prevCommand).super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_prevCommand).super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_currCommand = (Command *)0x0;
  (this->m_prevCommand).super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_args).
  super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_command = (Command *)0x0;
  (this->m_args).
  super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_args).
  super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_opt = opt;
  (this->m_positional).d.d = (Data *)0x0;
  (this->m_positional).d.ptr = (String *)0x0;
  (this->m_positional).d.size = 0;
  (this->m_positionalDescription).m_str.d.d = (Data *)0x0;
  (this->m_positionalDescription).m_str.d.ptr = (char16_t *)0x0;
  (this->m_positionalDescription).m_str.d.size = 0;
  return;
}

Assistant:

CmdLine::CmdLine( int argc, const char * const * argv, CmdLineOpts opt )
#endif
	:	details::API< CmdLine, CmdLine, ArgPtr, true > ( *this, *this )
	,	m_context( details::makeContext( argc, argv ) )
	,	m_command( nullptr )
	,	m_currCommand( nullptr )
	,	m_opt( opt )
{
}